

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

bool pybind11::detail::apply_exception_translators
               (forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                *translators)

{
  _func_void_exception_ptr *p_Var1;
  exception_ptr this;
  bool bVar2;
  exception_ptr local_48;
  reference local_40;
  _func_void_exception_ptr **translator;
  iterator __end2;
  iterator __begin2;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range2;
  exception_ptr last_exception;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *translators_local;
  
  last_exception._M_exception_object = translators;
  std::current_exception();
  this._M_exception_object = last_exception._M_exception_object;
  __end2 = std::
           forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
           ::begin((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                    *)last_exception._M_exception_object);
  translator = (_func_void_exception_ptr **)
               std::
               forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
               ::end((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                      *)this._M_exception_object);
  bVar2 = std::operator!=(&__end2,(_Self *)&translator);
  if (bVar2) {
    local_40 = std::_Fwd_list_iterator<void_(*)(std::__exception_ptr::exception_ptr)>::operator*
                         (&__end2);
    p_Var1 = *local_40;
    std::__exception_ptr::exception_ptr::exception_ptr(&local_48,(exception_ptr *)&__range2);
    (*p_Var1)((exception_ptr)&local_48);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_48);
  }
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&__range2);
  return bVar2;
}

Assistant:

inline bool apply_exception_translators(std::forward_list<ExceptionTranslator> &translators) {
    auto last_exception = std::current_exception();

    for (auto &translator : translators) {
        try {
            translator(last_exception);
            return true;
        } catch (...) {
            last_exception = std::current_exception();
        }
    }
    return false;
}